

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnSelectExpr
          (BinaryReaderIR *this,Index result_count,Type *result_types)

{
  Result RVar1;
  undefined1 local_50 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_48;
  undefined1 local_40 [8];
  TypeVector results;
  Type *result_types_local;
  Index result_count_local;
  BinaryReaderIR *this_local;
  
  results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = result_types;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_40);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::assign<wabt::Type*,void>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)local_40,
             results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + result_count);
  std::make_unique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>&>
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_50);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::SelectExpr,std::default_delete<wabt::SelectExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_48,
             (unique_ptr<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>_> *)local_50);
  RVar1 = AppendExpr(this,&local_48);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_48);
  std::unique_ptr<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>_>::~unique_ptr
            ((unique_ptr<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>_> *)local_50);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_40);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSelectExpr(Index result_count, Type* result_types) {
  TypeVector results;
  results.assign(result_types, result_types + result_count);
  return AppendExpr(std::make_unique<SelectExpr>(results));
}